

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::SectionEntry::listsection(SectionEntry *this,ImgfsFile *imgfs)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  ulong local_20;
  size_t compsize;
  ImgfsFile *imgfs_local;
  SectionEntry *this_local;
  
  compsize = (size_t)imgfs;
  imgfs_local = (ImgfsFile *)this;
  if (g_verbose < 2) {
    uVar4 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar2 = this->_nextsection;
    DirEntry::entstring_abi_cxx11_(&local_90,&this->super_DirEntry);
    uVar5 = std::__cxx11::string::c_str();
    nameinfo::name_abi_cxx11_(&local_b0,&this->_name,(ImgfsFile *)compsize);
    uVar6 = std::__cxx11::string::c_str();
    printf("         %08x: n->%08x %9d                        %s %s\n",(ulong)uVar4,(ulong)uVar2,
           (ulong)uVar1,uVar5,uVar6);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    local_20 = DirEntry::calc_compressed_size(&this->super_DirEntry,imgfs);
    uVar4 = DirEntry::offset(&this->super_DirEntry);
    uVar3 = local_20;
    uVar1 = (this->super_DirEntry)._size;
    uVar2 = this->_nextsection;
    DirEntry::entstring_abi_cxx11_(&local_40,&this->super_DirEntry);
    uVar5 = std::__cxx11::string::c_str();
    nameinfo::name_abi_cxx11_(&local_60,&this->_name,(ImgfsFile *)compsize);
    uVar6 = std::__cxx11::string::c_str();
    printf("         %08x: n->%08x %9d %9d                       %s %s\n",(ulong)uVar4,(ulong)uVar2,
           (ulong)uVar1,uVar3 & 0xffffffff,uVar5,uVar6);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void listsection(ImgfsFile& imgfs)
        {
            if (g_verbose>1) {
                size_t compsize= calc_compressed_size(imgfs);
                printf("         %08x: n->%08x %9d %9d                       %s %s\n",
                        offset(), _nextsection, _size, int(compsize), entstring().c_str(), _name.name(imgfs).c_str());
            }
            else {
                printf("         %08x: n->%08x %9d                        %s %s\n",
                        offset(), _nextsection, _size, entstring().c_str(), _name.name(imgfs).c_str());
            }
        }